

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

int __thiscall GameLoop::loop(GameLoop *this,int maxTurn)

{
  pointer ppPVar1;
  Player *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (maxTurn == -1) {
    iVar6 = -1;
  }
  else {
    iVar6 = (int)((ulong)((long)(this->allPlayers->
                                super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->allPlayers->
                               super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * maxTurn;
  }
  iVar7 = 1;
  iVar5 = 0;
  do {
    ppPVar1 = (this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    if (uVar4 <= (ulong)(long)iVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    this_00 = ppPVar1[iVar5];
    if ((this_00->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->pOwnedCountries->
        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar5 = iVar5 + 1;
      if (uVar4 == (long)iVar5) {
        iVar5 = 0;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\x1b[0m\n--------------------------------------------------------\n----------------------TURN "
                 ,0x59);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"----------------------------\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"--------------------------------------------------------",0x38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[35m",5);
      Player::reinforce(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[33m",5);
      Player::attack(this_00);
      pvVar2 = this->gameMap->pMapCountries;
      if ((long)(this_00->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this_00->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start ==
          (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start) {
        Player::notifyAll(this_00);
        std::ostream::flush();
        return *this_00->pPlayerId;
      }
      iVar6 = iVar6 + -1;
      iVar5 = iVar5 + 1;
      if ((long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == (long)iVar5) {
        iVar5 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[34m",5);
      Player::fortify(this_00);
      iVar7 = iVar7 + 1;
    }
  } while ((maxTurn == -1) || (0 < iVar6));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1m\x1b[33m",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"There are no more turns left. It is a draw!!",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return -1;
}

Assistant:

int GameLoop::loop(int maxTurn) {
    bool gameNotDone;
    int currentPlayerPosition = 0;
    Player* currentPlayer = nullptr;
    int turnCounter = 1;

    //limit or not number of turns
    int turnsLeft = -1;
    bool limitTurns = false;
    if (maxTurn != -1) {
        turnsLeft = maxTurn * int(allPlayers->size());
        limitTurns = true;
    }

    do {
        currentPlayer = allPlayers->at(currentPlayerPosition);
        if (!currentPlayer->getOwnedCountries()->empty()) {
            std::cout << "\u001b[0m\n--------------------------------------------------------\n"
                         "----------------------TURN " << turnCounter << "----------------------------\n"
                      << "--------------------------------------------------------" << std::endl;
            turnsLeft--;

            cout << "\u001b[35m";
            currentPlayer->reinforce();

            cout << "\u001b[33m";
            currentPlayer->attack();

            gameNotDone = !isGameDone(currentPlayer, gameMap);

            if (gameNotDone) {
                currentPlayerPosition++;
                if (isRoundFinished(currentPlayerPosition)) {
                    currentPlayerPosition = 0;
                }
            } else {
                currentPlayer->notifyAll();
                cout.flush();
                return currentPlayer->getPlayerId();
            }

            cout << "\u001b[34m";
            currentPlayer->fortify();

            turnCounter++;
        } else {
            currentPlayerPosition++;
            if (isRoundFinished(currentPlayerPosition)) {
                currentPlayerPosition = 0;
            }
        }

        if (limitTurns && turnsLeft <= 0) {
            std::cout << "\033[1m\033[33m";
            std::cout << "There are no more turns left. It is a draw!!" << std::endl;
            return -1;
        }
    } while (true);
}